

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clparser_test.cc
# Opt level: O2

void __thiscall
CLParserTestParseFilenameFilter::~CLParserTestParseFilenameFilter
          (CLParserTestParseFilenameFilter *this)

{
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(CLParserTest, ParseFilenameFilter) {
  CLParser parser;
  string output, err;
  ASSERT_TRUE(parser.Parse(
      "foo.cc\r\n"
      "cl: warning\r\n",
      "", &output, &err));
  ASSERT_EQ("cl: warning\n", output);
}